

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testJSONHelpers.cxx
# Opt level: O3

bool anon_unknown.dwarf_baa8f::testRequired(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  ostream *poVar5;
  bool bVar6;
  int i;
  string str;
  cmJSONState state;
  Value v;
  int local_fc;
  cmJSONState *local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  ValueHolder local_d0 [5];
  cmJSONState local_a8;
  Value local_50;
  
  Json::Value::Value(&local_50,"Hello");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"default","");
  local_fc = 1;
  paVar1 = &local_a8.doc.field_2;
  local_a8.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.parseStack.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.errors.super__Vector_base<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.parseStack.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.parseStack.
  super__Vector_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.doc._M_string_length = 0;
  local_a8.doc.field_2._M_local_buf[0] = '\0';
  local_a8.doc._M_dataplus._M_p = (pointer)paVar1;
  if ((anonymous_namespace)::RequiredStringHelper_abi_cxx11_._16_8_ == 0) goto LAB_001b620f;
  local_f8 = &local_a8;
  local_d0[0].string_ = (char *)&local_50;
  cVar2 = (*(code *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_._24_8_)
                    ((anonymous_namespace)::RequiredStringHelper_abi_cxx11_,&local_f0,local_d0,
                     &local_f8);
  if (cVar2 == '\0') {
    iVar4 = 0x1c5;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "ASSERT_TRUE(RequiredStringHelper(str, &v, &state)) failed on line ",0x42);
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)&local_f0);
    if (iVar4 == 0) {
      if ((anonymous_namespace)::RequiredIntHelper._16_8_ == 0) {
LAB_001b620f:
        local_d0[0].string_ = (char *)&local_50;
        local_f8 = &local_a8;
        std::__throw_bad_function_call();
      }
      local_f8 = &local_a8;
      local_d0[0].string_ = (char *)&local_50;
      cVar2 = (*(code *)(anonymous_namespace)::RequiredIntHelper._24_8_)
                        ((anonymous_namespace)::RequiredIntHelper,&local_fc,local_d0,&local_f8);
      if (cVar2 == '\0') {
        Json::Value::Value((Value *)local_d0,2);
        Json::Value::operator=(&local_50,(Value *)local_d0);
        Json::Value::~Value((Value *)local_d0);
        std::__cxx11::string::_M_replace
                  ((ulong)&local_f0,0,(char *)local_f0._M_string_length,0x972a7f);
        local_fc = 1;
        if ((anonymous_namespace)::RequiredStringHelper_abi_cxx11_._16_8_ == 0) goto LAB_001b620f;
        local_f8 = &local_a8;
        local_d0[0].string_ = (char *)&local_50;
        cVar2 = (*(code *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_._24_8_)
                          ((anonymous_namespace)::RequiredStringHelper_abi_cxx11_,&local_f0,local_d0
                           ,&local_f8);
        if (cVar2 == '\0') {
          if ((anonymous_namespace)::RequiredIntHelper._16_8_ == 0) goto LAB_001b620f;
          local_f8 = &local_a8;
          local_d0[0].string_ = (char *)&local_50;
          cVar2 = (*(code *)(anonymous_namespace)::RequiredIntHelper._24_8_)
                            ((anonymous_namespace)::RequiredIntHelper,&local_fc,local_d0,&local_f8);
          if (cVar2 == '\0') {
            iVar4 = 0x1cd;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,
                       "ASSERT_TRUE(RequiredIntHelper(i, &v, &state)) failed on line ",0x3d);
          }
          else if (local_fc == 2) {
            std::__cxx11::string::operator=((string *)&local_f0,"default");
            local_fc = 1;
            bVar3 = std::
                    function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                    ::operator()((function<bool_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_Json::Value_*,_cmJSONState_*)>
                                  *)(anonymous_namespace)::RequiredStringHelper_abi_cxx11_,&local_f0
                                 ,(Value *)0x0,&local_a8);
            if (bVar3) {
              iVar4 = 0x1d2;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "ASSERT_TRUE(!RequiredStringHelper(str, nullptr, &state)) failed on line ",
                         0x48);
            }
            else {
              bVar3 = std::function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)>::operator()
                                ((function<bool_(int_&,_const_Json::Value_*,_cmJSONState_*)> *)
                                 (anonymous_namespace)::RequiredIntHelper,&local_fc,(Value *)0x0,
                                 &local_a8);
              bVar6 = true;
              if (!bVar3) goto LAB_001b5f81;
              iVar4 = 0x1d3;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&std::cout,
                         "ASSERT_TRUE(!RequiredIntHelper(i, nullptr, &state)) failed on line ",0x43)
              ;
            }
          }
          else {
            iVar4 = 0x1ce;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cout,"ASSERT_TRUE(i == 2) failed on line ",0x23);
          }
        }
        else {
          iVar4 = 0x1cc;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cout,
                     "ASSERT_TRUE(!RequiredStringHelper(str, &v, &state)) failed on line ",0x43);
        }
      }
      else {
        iVar4 = 0x1c7;
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cout,
                   "ASSERT_TRUE(!RequiredIntHelper(i, &v, &state)) failed on line ",0x3e);
      }
    }
    else {
      iVar4 = 0x1c6;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"ASSERT_TRUE(str == \"Hello\") failed on line ",0x2b);
    }
  }
  poVar5 = (ostream *)std::ostream::operator<<(&std::cout,iVar4);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\n",1);
  bVar6 = false;
LAB_001b5f81:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a8.doc._M_dataplus._M_p != paVar1) {
    operator_delete(local_a8.doc._M_dataplus._M_p,
                    CONCAT71(local_a8.doc.field_2._M_allocated_capacity._1_7_,
                             local_a8.doc.field_2._M_local_buf[0]) + 1);
  }
  std::vector<cmJSONState::Error,_std::allocator<cmJSONState::Error>_>::~vector(&local_a8.errors);
  std::
  vector<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_Json::Value_*>_>_>
  ::~vector(&local_a8.parseStack);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f0._M_dataplus._M_p != &local_f0.field_2) {
    operator_delete(local_f0._M_dataplus._M_p,local_f0.field_2._M_allocated_capacity + 1);
  }
  Json::Value::~Value(&local_50);
  return bVar6;
}

Assistant:

bool testRequired()
{
  Json::Value v = "Hello";
  std::string str = "default";
  int i = 1;
  cmJSONState state;
  ASSERT_TRUE(RequiredStringHelper(str, &v, &state));
  ASSERT_TRUE(str == "Hello");
  ASSERT_TRUE(!RequiredIntHelper(i, &v, &state));

  v = 2;
  str = "default";
  i = 1;
  ASSERT_TRUE(!RequiredStringHelper(str, &v, &state));
  ASSERT_TRUE(RequiredIntHelper(i, &v, &state));
  ASSERT_TRUE(i == 2);

  str = "default";
  i = 1;
  ASSERT_TRUE(!RequiredStringHelper(str, nullptr, &state));
  ASSERT_TRUE(!RequiredIntHelper(i, nullptr, &state));

  return true;
}